

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximpl.h
# Opt level: O2

int __thiscall YAML::RegEx::Match<YAML::StreamCharSource>(RegEx *this,StreamCharSource *source)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = StreamCharSource::operator_cast_to_bool(source);
  if (bVar1) {
    iVar2 = MatchUnchecked<YAML::StreamCharSource>(this,source);
    return iVar2;
  }
  return -1;
}

Assistant:

inline int RegEx::Match(const Source& source) const {
  return IsValidSource(source) ? MatchUnchecked(source) : -1;
}